

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::EnergyScan
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  anon_class_88_7_d284b45c local_a0;
  AsyncRequest local_48;
  uint16_t local_22;
  uint16_t local_20;
  uint8_t local_1d;
  uint32_t uStack_1c;
  uint16_t aScanDuration_local;
  uint16_t aPeriod_local;
  uint8_t aCount_local;
  uint32_t aChannelMask_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_a0.this = this;
  local_22 = aScanDuration;
  local_20 = aPeriod;
  local_1d = aCount;
  uStack_1c = aChannelMask;
  _aPeriod_local = aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_a0.aHandler,aHandler);
  local_a0.aChannelMask = uStack_1c;
  local_a0.aCount = local_1d;
  local_a0.aPeriod = local_20;
  local_a0.aScanDuration = local_22;
  std::__cxx11::string::string((string *)&local_a0.aDstAddr,(string *)aDstAddr);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_48,&local_a0);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_a0);
  return;
}

Assistant:

void CommissionerSafe::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->EnergyScan(aHandler, aChannelMask, aCount, aPeriod, aScanDuration, aDstAddr); });
}